

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

void __thiscall
amrex::DistributionMapping::KnapSackProcessorMap
          (DistributionMapping *this,BoxArray *boxes,int nprocs)

{
  element_type *peVar1;
  size_type __n;
  long lVar2;
  Long LVar3;
  long lVar4;
  long extraout_RDX;
  ulong uVar5;
  vector<long,_std::allocator<long>_> wgts;
  Real effi;
  
  peVar1 = (boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             (this->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             ((long)*(pointer *)
                     ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data + 8) -
             *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data) / 0x1c);
  peVar1 = (boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __n = ((long)*(pointer *)
                ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data + 8) -
        *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data) / 0x1c;
  if ((1 < nprocs) && ((long)nprocs < (long)__n)) {
    std::vector<long,_std::allocator<long>_>::vector(&wgts,__n,(allocator_type *)&effi);
    peVar1 = (boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar2 = (long)*(pointer *)
                   ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data + 8) -
            *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data;
    lVar4 = lVar2 % 0x1c;
    for (uVar5 = 0; (lVar2 / 0x1c & 0xffffffffU) != uVar5; uVar5 = uVar5 + 1) {
      BoxArray::operator[]((Box *)&effi,boxes,(int)uVar5);
      LVar3 = Box::numPts((Box *)&effi);
      wgts.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = LVar3;
      lVar4 = extraout_RDX;
    }
    effi = 0.0;
    KnapSackDoIt(this,&wgts,(int)lVar4,&effi,true,0x7fffffff,true);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&wgts.super__Vector_base<long,_std::allocator<long>_>);
    return;
  }
  RoundRobinProcessorMap(this,boxes,nprocs);
  return;
}

Assistant:

void
DistributionMapping::KnapSackProcessorMap (const BoxArray& boxes,
                                           int             nprocs)
{
    BL_ASSERT(boxes.size() > 0);

    m_ref->m_pmap.resize(boxes.size());

    if (boxes.size() <= nprocs || nprocs < 2)
    {
        RoundRobinProcessorMap(boxes,nprocs);
    }
    else
    {
        std::vector<Long> wgts(boxes.size());

        for (unsigned int i = 0, N = boxes.size(); i < N; ++i)
            wgts[i] = boxes[i].numPts();

        Real effi = 0;
        bool do_full_knapsack = true;
        KnapSackDoIt(wgts, nprocs, effi, do_full_knapsack);
    }
}